

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeDefs.cpp
# Opt level: O2

void __thiscall xe::Error::Error(Error *this,char *message,char *expr,char *file,int line)

{
  ostream *poVar1;
  char *pcVar2;
  string asStack_1c8 [32];
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  pcVar2 = "Runtime check failed";
  if (message != (char *)0x0) {
    pcVar2 = message;
  }
  poVar1 = std::operator<<((ostream *)local_1a8,pcVar2);
  std::operator<<(poVar1,": ");
  if (expr != (char *)0x0) {
    poVar1 = std::operator<<((ostream *)local_1a8,'\'');
    poVar1 = std::operator<<(poVar1,expr);
    std::operator<<(poVar1,'\'');
  }
  poVar1 = std::operator<<((ostream *)local_1a8," at ");
  poVar1 = std::operator<<(poVar1,file);
  poVar1 = std::operator<<(poVar1,":");
  std::ostream::operator<<(poVar1,line);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::runtime_error::runtime_error(&this->super_runtime_error,asStack_1c8);
  std::__cxx11::string::~string(asStack_1c8);
  *(undefined ***)this = &PTR__runtime_error_00126e60;
  return;
}

Assistant:

Error::Error (const char* message, const char* expr, const char* file, int line)
	: std::runtime_error(formatError(message, expr, file, line))
{
}